

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling.cpp
# Opt level: O0

qreal QHighDpiScaling::roundScaleFactor(qreal rawFactor)

{
  HighDpiScaleFactorRoundingPolicy HVar1;
  int iVar2;
  double *pdVar3;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  HighDpiScaleFactorRoundingPolicy scaleFactorRoundingPolicy;
  qreal roundedFactor;
  int local_3c;
  double local_18;
  double local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  HVar1 = QGuiApplication::highDpiScaleFactorRoundingPolicy();
  local_10 = in_XMM0_Qa;
  switch(HVar1) {
  case Unset:
  case PassThrough:
    break;
  case Round:
    iVar2 = qRound(1.84647203226814e-317);
    local_10 = (double)iVar2;
    break;
  case Ceil:
    iVar2 = qCeil<double>(1.84648487797493e-317);
    local_10 = (double)iVar2;
    break;
  case Floor:
    iVar2 = qFloor<double>(1.84649624148478e-317);
    local_10 = (double)iVar2;
    break;
  case RoundPreferFloor:
    iVar2 = qFloor<double>(1.84651353378239e-317);
    if (0.75 <= in_XMM0_Qa - (double)iVar2) {
      local_3c = qCeil<double>(1.84654120145855e-317);
    }
    else {
      local_3c = qFloor<double>(1.84653280234258e-317);
    }
    local_10 = (double)local_3c;
  }
  local_18 = 1.0;
  pdVar3 = qMax<double>(&local_10,&local_18);
  local_10 = *pdVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

qreal QHighDpiScaling::roundScaleFactor(qreal rawFactor)
{
    // Apply scale factor rounding policy. Using mathematically correct rounding
    // may not give the most desirable visual results, especially for
    // critical fractions like .5. In general, rounding down results in visual
    // sizes that are smaller than the ideal size, and opposite for rounding up.
    // Rounding down is then preferable since "small UI" is a more acceptable
    // high-DPI experience than "large UI".

    Qt::HighDpiScaleFactorRoundingPolicy scaleFactorRoundingPolicy =
        QGuiApplication::highDpiScaleFactorRoundingPolicy();

    // Apply rounding policy.
    qreal roundedFactor = rawFactor;
    switch (scaleFactorRoundingPolicy) {
    case Qt::HighDpiScaleFactorRoundingPolicy::Round:
        roundedFactor = qRound(rawFactor);
        break;
    case Qt::HighDpiScaleFactorRoundingPolicy::Ceil:
        roundedFactor = qCeil(rawFactor);
        break;
    case Qt::HighDpiScaleFactorRoundingPolicy::Floor:
        roundedFactor = qFloor(rawFactor);
        break;
    case Qt::HighDpiScaleFactorRoundingPolicy::RoundPreferFloor:
        // Round up for .75 and higher. This favors "small UI" over "large UI".
        roundedFactor = rawFactor - qFloor(rawFactor) < 0.75
            ? qFloor(rawFactor) : qCeil(rawFactor);
        break;
    case Qt::HighDpiScaleFactorRoundingPolicy::PassThrough:
    case Qt::HighDpiScaleFactorRoundingPolicy::Unset:
        break;
    }

    // Clamp the minimum factor to 1. Qt does not currently render
    // correctly with factors less than 1.
    roundedFactor = qMax(roundedFactor, qreal(1));

    return roundedFactor;
}